

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool __thiscall interpreter::Interpreter::checkParseErrors(Interpreter *this)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err;
  pointer pbVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  bVar1 = parser::Parser::hasErrors(*(Parser **)this);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)(this + 0x10));
    poVar2 = std::operator<<(poVar2,": ");
    std::endl<char,std::char_traits<char>>(poVar2);
    parser::Parser::Errors_abi_cxx11_(&local_38,*(Parser **)this);
    for (pbVar3 = local_38.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 != local_38.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)pbVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_38);
  }
  return bVar1;
}

Assistant:

bool  interpreter::Interpreter::checkParseErrors()
{
    if(this->parser->hasErrors()){
        cout << this->src_file_path << ": " << endl;
        for(auto &err: this->parser->Errors()){
            cout << err << endl;
        }
        return true;
    }
    return false;
}